

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<const_solitaire::interfaces::Button_&()>::ShouldHandleArguments
          (TypedExpectation<const_solitaire::interfaces::Button_&()> *this,ArgumentTuple *args)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (((this->super_ExpectationBase).retired_ == false) &&
     (bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase), bVar1)) {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0031e0e8;
    bVar1 = MatcherBase<const_std::tuple<>_&>::MatchAndExplain
                      (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>,args,
                       &local_28);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }